

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
libcellml::Validator::ValidatorImpl::checkUniqueResetOrders(ValidatorImpl *this,ModelPtr *model)

{
  IssueImpl *this_00;
  bool bVar1;
  reference ppVar2;
  iterator __first;
  size_type sVar3;
  size_type sVar4;
  element_type *peVar5;
  element_type *this_01;
  element_type *peVar6;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  IssuePtr issue;
  undefined1 local_d0 [8];
  set<int,_std::less<int>,_std::allocator<int>_> ordersSet;
  undefined1 local_90 [8];
  vector<int,_std::allocator<int>_> orders;
  shared_ptr<libcellml::Variable> variable;
  pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>
  *variableOrder;
  iterator __end1;
  iterator __begin1;
  ResetOrderMap *__range1;
  ResetOrderMap resetOrderMap;
  ModelPtr *model_local;
  ValidatorImpl *this_local;
  
  resetOrderMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)model;
  buildModelResetOrderMap((ResetOrderMap *)&__range1,this,model);
  __end1 = std::
           map<std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>,_std::less<std::shared_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::begin((map<std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>,_std::less<std::shared_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)&__range1);
  variableOrder =
       (pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_> *)
       std::
       map<std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>,_std::less<std::shared_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::end((map<std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>,_std::less<std::shared_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)&__range1);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&variableOrder);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<libcellml::Variable>::shared_ptr
              ((shared_ptr<libcellml::Variable> *)
               &orders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&ppVar2->first);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_90,&ppVar2->second);
    __first = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_90);
    issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_90);
    std::set<int,std::less<int>,std::allocator<int>>::
    set<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((set<int,std::less<int>,std::allocator<int>> *)local_d0,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi);
    sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_d0);
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_90);
    if (sVar3 < sVar4) {
      Issue::IssueImpl::create();
      peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f0);
      Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,RESET_ORDER_UNIQUE);
      peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f0);
      this_00 = peVar5->mPimpl;
      this_01 = std::
                __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&orders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
      NamedEntity::name_abi_cxx11_(&local_150,&this_01->super_NamedEntity);
      std::operator+(&local_130,"Variable \'",&local_150);
      std::operator+(&local_110,&local_130,
                     "\' used in resets does not have unique order values across the equivalent variable set."
                    );
      Issue::IssueImpl::setDescription(this_00,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f0);
      peVar6 = std::
               __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar5->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setModel
                (peVar6->mPimpl,
                 (ModelPtr *)resetOrderMap._M_t._M_impl.super__Rb_tree_header._M_node_count,MODEL);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_f0);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_f0);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_d0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
    std::shared_ptr<libcellml::Variable>::~shared_ptr
              ((shared_ptr<libcellml::Variable> *)
               &orders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    std::
    _Rb_tree_iterator<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++(&__end1);
  }
  std::
  map<std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>,_std::less<std::shared_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>,_std::less<std::shared_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)&__range1);
  return;
}

Assistant:

void Validator::ValidatorImpl::checkUniqueResetOrders(const ModelPtr &model)
{
    auto resetOrderMap = buildModelResetOrderMap(model);
    for (const auto &variableOrder : resetOrderMap) {
        auto variable = variableOrder.first;
        auto orders = variableOrder.second;

        std::set<int> ordersSet(orders.begin(), orders.end());

        if (ordersSet.size() < orders.size()) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_UNIQUE);
            issue->mPimpl->setDescription("Variable '" + variable->name() + "' used in resets does not have unique order values across the equivalent variable set.");
            issue->mPimpl->mItem->mPimpl->setModel(model);
            addIssue(issue);
        }
    }
}